

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

PinholeCamera * __thiscall gmath::PinholeCamera::operator=(PinholeCamera *this,PinholeCamera *pc)

{
  double dVar1;
  int i_1;
  int iVar2;
  Matrix33d *pMVar3;
  Matrix33d *pMVar4;
  undefined4 extraout_var;
  int k;
  long lVar5;
  long lVar6;
  
  if (this != pc) {
    std::__cxx11::string::_M_assign((string *)&(this->super_Camera).name);
    lVar5 = (pc->super_Camera).height;
    (this->super_Camera).width = (pc->super_Camera).width;
    (this->super_Camera).height = lVar5;
    pMVar3 = &(this->super_Camera).R;
    pMVar4 = &(pc->super_Camera).R;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        pMVar3->v[0][lVar6] = pMVar4->v[0][lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar5 = lVar5 + 1;
      pMVar3 = (Matrix33d *)(pMVar3->v + 1);
      pMVar4 = (Matrix33d *)(pMVar4->v + 1);
    } while (lVar5 != 3);
    lVar5 = 0;
    do {
      (this->super_Camera).T.v[lVar5] = (pc->super_Camera).T.v[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    dVar1 = (pc->super_Camera).zmax;
    (this->super_Camera).zmin = (pc->super_Camera).zmin;
    (this->super_Camera).zmax = dVar1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->super_Camera).match,&(pc->super_Camera).match);
    pMVar3 = &pc->A;
    pMVar4 = &this->A;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        pMVar4->v[0][lVar6] = pMVar3->v[0][lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar5 = lVar5 + 1;
      pMVar4 = (Matrix33d *)(pMVar4->v + 1);
      pMVar3 = (Matrix33d *)(pMVar3->v + 1);
    } while (lVar5 != 3);
    this->rho = pc->rho;
    if (this->dist != (Distortion *)0x0) {
      (*this->dist->_vptr_Distortion[1])();
    }
    this->dist = (Distortion *)0x0;
    if (pc->dist != (Distortion *)0x0) {
      iVar2 = (*pc->dist->_vptr_Distortion[2])();
      this->dist = (Distortion *)CONCAT44(extraout_var,iVar2);
    }
  }
  return this;
}

Assistant:

PinholeCamera &PinholeCamera::operator = (const PinholeCamera &pc)
{
  if (this != &pc)
  {
    Camera::operator=(pc);

    A=pc.A;
    rho=pc.rho;

    delete dist;
    dist=0;

    if (pc.dist != 0)
    {
      dist=pc.dist->clone();
    }
  }

  return *this;
}